

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Abc_Nam_t * Acb_VerilogStartNames(void)

{
  uint uVar1;
  Abc_Nam_t *p;
  uint uVar2;
  char *pStr;
  int *piVar3;
  int fFound;
  int local_2c;
  
  p = Abc_NamStart(100,0x10);
  uVar2 = 1;
  piVar3 = &DAT_009a8ac4;
  while( true ) {
    if (uVar2 < 0xe) {
      pStr = (char *)((long)&DAT_009a8ac4 + (long)*piVar3);
    }
    else {
      pStr = (char *)0x0;
    }
    uVar1 = Abc_NamStrFindOrAdd(p,pStr,&local_2c);
    if ((uVar2 != uVar1) || (local_2c != 0)) break;
    uVar2 = uVar2 + 1;
    piVar3 = piVar3 + 1;
    if (uVar2 == 0xe) {
      return p;
    }
  }
  __assert_fail("i == NameId && !fFound",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0xb0,"Abc_Nam_t *Acb_VerilogStartNames()");
}

Assistant:

Abc_Nam_t * Acb_VerilogStartNames()
{
    Abc_Nam_t * pNames = Abc_NamStart( 100, 16 ); 
    int i, NameId, fFound;
    for ( i = 1; i < ACB_UNUSED; i++ )
    {
        NameId = Abc_NamStrFindOrAdd( pNames, Acb_Num2Name(i), &fFound );
        assert( i == NameId && !fFound );
    }
    return pNames;
}